

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdSkel.cc
# Opt level: O1

bool __thiscall
tinyusdz::BlendShape::add_inbetweenBlendShape(BlendShape *this,double weight,Attribute *attr)

{
  bool bVar1;
  mapped_type *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string attr_name;
  string local_648;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> local_628;
  undefined1 local_610 [72];
  any local_5c8;
  bool local_5b0;
  pointer local_5a8;
  pointer local_5a0;
  pointer local_598;
  bool local_590;
  pointer local_588;
  pointer local_580;
  pointer local_578;
  AttrMetas AStack_570;
  ListEditQual local_368;
  Type TStack_364;
  Type local_360;
  Path PStack_358;
  pointer local_288;
  pointer local_280;
  pointer local_278;
  ListEditQual local_270;
  AttrMetas AStack_268;
  bool local_60;
  string asStack_58 [32];
  bool local_38;
  
  bVar1 = false;
  if (((attr->_name)._M_string_length != 0) && (attr->_variability != Uniform)) {
    bVar1 = Attribute::is_value(attr);
    if (bVar1) {
      local_610._0_8_ = local_610 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"{}:{}","");
      fmt::format<char_const*,std::__cxx11::string>
                (&local_648,(fmt *)local_610,(string *)&kInbetweensNamespace,(char **)attr,in_R8);
      if ((undefined1 *)local_610._0_8_ != local_610 + 0x10) {
        operator_delete((void *)local_610._0_8_,local_610._16_8_ + 1);
      }
      ::std::__cxx11::string::_M_assign((string *)attr);
      (attr->_metas).weight.contained = (storage_t<double>)weight;
      if ((attr->_metas).weight.has_value_ == false) {
        (attr->_metas).weight.has_value_ = true;
      }
      Property::Property((Property *)local_610,attr,false);
      this_00 = ::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                ::operator[](&this->props,&local_648);
      ::std::__cxx11::string::operator=((string *)this_00,(string *)local_610);
      (this_00->_attrib)._variability = local_610._32_4_;
      (this_00->_attrib)._varying_authored = local_610[0x24];
      ::std::__cxx11::string::operator=
                ((string *)&(this_00->_attrib)._type_name,(string *)(local_610 + 0x28));
      linb::any::operator=((any *)&(this_00->_attrib)._var,&local_5c8);
      (this_00->_attrib)._var._blocked = local_5b0;
      local_628.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(this_00->_attrib)._var._ts._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_628.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish =
           *(pointer *)
            ((long)&(this_00->_attrib)._var._ts._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data + 8);
      local_628.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           *(pointer *)
            ((long)&(this_00->_attrib)._var._ts._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data + 0x10);
      (this_00->_attrib)._var._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start = local_5a8;
      *(pointer *)
       ((long)&(this_00->_attrib)._var._ts._samples.
               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               ._M_impl.super__Vector_impl_data + 8) = local_5a0;
      *(pointer *)
       ((long)&(this_00->_attrib)._var._ts._samples.
               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               ._M_impl.super__Vector_impl_data + 0x10) = local_598;
      local_5a8 = (pointer)0x0;
      local_5a0 = (pointer)0x0;
      local_598 = (pointer)0x0;
      ::std::
      vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 *)&local_628);
      (this_00->_attrib)._var._ts._dirty = local_590;
      local_628.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start =
           (this_00->_attrib)._paths.
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_628.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (this_00->_attrib)._paths.
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_628.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (this_00->_attrib)._paths.
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (this_00->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
      _M_impl.super__Vector_impl_data._M_start = local_588;
      (this_00->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
      _M_impl.super__Vector_impl_data._M_finish = local_580;
      (this_00->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = local_578;
      local_588 = (pointer)0x0;
      local_580 = (pointer)0x0;
      local_578 = (pointer)0x0;
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&local_628);
      AttrMetas::operator=(&(this_00->_attrib)._metas,&AStack_570);
      this_00->_listOpQual = local_368;
      this_00->_type = TStack_364;
      (this_00->_rel).type = local_360;
      Path::operator=(&(this_00->_rel).targetPath,&PStack_358);
      local_628.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start =
           (this_00->_rel).targetPathVector.
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_628.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (this_00->_rel).targetPathVector.
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_628.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (this_00->_rel).targetPathVector.
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (this_00->_rel).targetPathVector.
      super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start = local_288;
      (this_00->_rel).targetPathVector.
      super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish = local_280;
      (this_00->_rel).targetPathVector.
      super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_278;
      local_288 = (pointer)0x0;
      local_280 = (pointer)0x0;
      local_278 = (pointer)0x0;
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&local_628);
      (this_00->_rel).listOpQual = local_270;
      AttrMetas::operator=(&(this_00->_rel)._metas,&AStack_268);
      (this_00->_rel)._varying_authored = local_60;
      ::std::__cxx11::string::operator=((string *)&this_00->_prop_value_type_name,asStack_58);
      this_00->_has_custom = local_38;
      Property::~Property((Property *)local_610);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_648._M_dataplus._M_p != &local_648.field_2) {
        operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
      }
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool BlendShape::add_inbetweenBlendShape(const double weight, Attribute &&attr) {

  if (attr.name().empty()) {
    return false;
  }

  if (attr.is_uniform()) {
    return false;
  }

  if (!attr.is_value()) {
    return false;
  }

  std::string attr_name = fmt::format("{}:{}", kInbetweensNamespace, attr.name());
  attr.set_name(attr_name);

  attr.metas().weight = weight;

  props[attr_name] = Property(attr, /* custom */false);

  return true;
}